

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

OPAtomIndexFooter * __thiscall
ASDCP::MXF::OPAtomIndexFooter::InitFromBuffer(OPAtomIndexFooter *this,byte_t *p,ui32_t l)

{
  Dictionary *Dict;
  int iVar1;
  InterchangeObject *pIVar2;
  ui64_t uVar3;
  PacketList *this_00;
  ILogSink *pIVar4;
  uint in_ECX;
  undefined4 in_register_00000014;
  Result_t local_d0 [104];
  UL local_68;
  InterchangeObject *local_48;
  InterchangeObject *object;
  byte_t *local_30;
  byte_t *end_p;
  byte_t *pbStack_20;
  ui32_t l_local;
  byte_t *p_local;
  OPAtomIndexFooter *this_local;
  Result_t *result;
  
  pbStack_20 = (byte_t *)CONCAT44(in_register_00000014,l);
  end_p._3_1_ = 0;
  end_p._4_4_ = in_ECX;
  p_local = p;
  this_local = this;
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  local_30 = pbStack_20 + end_p._4_4_;
  while( true ) {
    iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (iVar1 < 0 || local_30 <= pbStack_20) {
      iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
      if (iVar1 < 0) {
        pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error(pIVar4,"Failed to initialize OPAtomIndexFooter.\n");
      }
      return this;
    }
    Dict = *(Dictionary **)(p + 0x78);
    UL::UL(&local_68,pbStack_20);
    pIVar2 = CreateObject(Dict,&local_68);
    UL::~UL(&local_68);
    local_48 = pIVar2;
    if (pIVar2 == (InterchangeObject *)0x0) break;
    pIVar2->m_Lookup = *(IPrimerLookup **)(p + 0x180);
    (*(pIVar2->super_KLVPacket)._vptr_KLVPacket[5])
              (local_d0,pIVar2,pbStack_20,(ulong)(uint)((int)local_30 - (int)pbStack_20));
    Kumu::Result_t::operator=((Result_t *)this,local_d0);
    Kumu::Result_t::~Result_t(local_d0);
    uVar3 = KLVPacket::PacketLength(&local_48->super_KLVPacket);
    pbStack_20 = pbStack_20 + uVar3;
    iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (iVar1 < 0) {
      pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar4,"Error initializing OPAtom footer packet.\n");
      if (local_48 != (InterchangeObject *)0x0) {
        (*(local_48->super_KLVPacket)._vptr_KLVPacket[1])();
      }
    }
    else {
      this_00 = mem_ptr<ASDCP::MXF::Partition::PacketList>::operator->
                          ((mem_ptr<ASDCP::MXF::Partition::PacketList> *)(p + 0x70));
      Partition::PacketList::AddPacket(this_00,local_48);
    }
  }
  __assert_fail("object",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp",
                0x481,
                "virtual ASDCP::Result_t ASDCP::MXF::OPAtomIndexFooter::InitFromBuffer(const byte_t *, ui32_t)"
               );
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::OPAtomIndexFooter::InitFromBuffer(const byte_t* p, ui32_t l)
{
  Result_t result = RESULT_OK;
  const byte_t* end_p = p + l;
  
  while ( ASDCP_SUCCESS(result) && p < end_p )
    {
      // parse the packets and index them by uid, discard KLVFill items
      InterchangeObject* object = CreateObject(m_Dict, p);
      assert(object);

      object->m_Lookup = m_Lookup;
      result = object->InitFromBuffer(p, end_p - p);
      p += object->PacketLength();

      if ( ASDCP_SUCCESS(result) )
	{
	  m_PacketList->AddPacket(object); // takes ownership
	}
      else
	{
	  DefaultLogSink().Error("Error initializing OPAtom footer packet.\n");
	  delete object;
	}
    }

  if ( ASDCP_FAILURE(result) )
    {
      DefaultLogSink().Error("Failed to initialize OPAtomIndexFooter.\n");
    }

  return result;
}